

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_matrix_z2_chain_vine.cpp
# Opt level: O1

void __thiscall
Chain_matrix_z2_vine_row_access<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true,_false,_false>_>_>
::test_method(Chain_matrix_z2_vine_row_access<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true,_false,_false>_>_>
              *this)

{
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true,_false,_false>_>
  m;
  function<bool_(unsigned_int,_unsigned_int)> local_138;
  function<bool_(unsigned_int,_unsigned_int)> local_118;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_f0;
  undefined1 local_d8 [208];
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true,false,false>>>>
            ();
  local_118.super__Function_base._M_functor._8_8_ = 0;
  local_118.super__Function_base._M_functor._M_unused._M_object = birth_comparator;
  local_118._M_invoker =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  local_118.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  local_138.super__Function_base._M_functor._8_8_ = 0;
  local_138.super__Function_base._M_functor._M_unused._M_object =
       Gudhi::persistence_matrix::_no_G_death_comparator;
  local_138._M_invoker =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  local_138.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  local_d8._0_8_ = operator_new(0x38);
  (((Column_settings *)local_d8._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (((Column_settings *)local_d8._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  (((Column_settings *)local_d8._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  (((Column_settings *)local_d8._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x20;
  (((Column_settings *)local_d8._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  (((Column_settings *)local_d8._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  (((Column_settings *)local_d8._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true,false,false>>>
  ::
  Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true,false,false>>>
              *)(local_d8 + 8),&local_f0,(Column_settings *)local_d8._0_8_,&local_118,&local_138);
  if (local_138.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_138.super__Function_base._M_manager)
              ((_Any_data *)&local_138,(_Any_data *)&local_138,__destroy_functor);
  }
  if (local_118.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_118.super__Function_base._M_manager)
              ((_Any_data *)&local_118,(_Any_data *)&local_118,__destroy_functor);
  }
  test_non_base_row_access<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true,false,false>>>
            ((Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true,_false,_false>_>
              *)local_d8);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true,_false,_false>_>
  ::~Matrix((Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true,_false,_false>_>
             *)local_d8);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_f0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(Chain_matrix_z2_vine_row_access, Matrix, row_access_matrices) {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, birth_comparator, Gudhi::persistence_matrix::_no_G_death_comparator);
  test_non_base_row_access<Matrix>(m);
}